

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::multiplyBy
          (DecimalQuantity *this,DecNum *multiplicand,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  uint uVar3;
  undefined1 local_80 [8];
  DecNum decnum;
  UErrorCode *status_local;
  DecNum *multiplicand_local;
  DecimalQuantity *this_local;
  
  decnum._88_8_ = status;
  uVar3 = (*(this->super_IFixedDecimal)._vptr_IFixedDecimal[4])();
  if ((((uVar3 & 1) == 0) && (bVar1 = isZero(this), !bVar1)) &&
     (uVar3 = (*(this->super_IFixedDecimal)._vptr_IFixedDecimal[3])(), (uVar3 & 1) == 0)) {
    DecNum::DecNum((DecNum *)local_80);
    toDecNum(this,(DecNum *)local_80,(UErrorCode *)decnum._88_8_);
    UVar2 = ::U_FAILURE(*(UErrorCode *)decnum._88_8_);
    if (UVar2 == '\0') {
      DecNum::multiplyBy((DecNum *)local_80,multiplicand,(UErrorCode *)decnum._88_8_);
      UVar2 = ::U_FAILURE(*(UErrorCode *)decnum._88_8_);
      if (UVar2 == '\0') {
        setToDecNum(this,(DecNum *)local_80,(UErrorCode *)decnum._88_8_);
      }
    }
    DecNum::~DecNum((DecNum *)local_80);
  }
  return;
}

Assistant:

void DecimalQuantity::multiplyBy(const DecNum& multiplicand, UErrorCode& status) {
    if (isInfinite() || isZero() || isNaN()) {
        return;
    }
    // Convert to DecNum, multiply, and convert back.
    DecNum decnum;
    toDecNum(decnum, status);
    if (U_FAILURE(status)) { return; }
    decnum.multiplyBy(multiplicand, status);
    if (U_FAILURE(status)) { return; }
    setToDecNum(decnum, status);
}